

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O2

void CB_EXPLORE::predict_or_learn_bag<true>(cb_explore *data,single_learner *base,example *ec)

{
  unkuint9 Var1;
  uint32_t uVar2;
  ulong uVar3;
  uint32_t i;
  uint uVar4;
  size_t i_1;
  ulong i_00;
  uint32_t j;
  action_score local_60;
  action_scores probs;
  
  probs._begin = (ec->pred).a_s._begin;
  probs._end = (ec->pred).a_s._end;
  probs.end_array = (ec->pred).a_s.end_array;
  probs.erase_count = (ec->pred).scalars.erase_count;
  v_array<ACTION_SCORE::action_score>::clear(&probs);
  for (uVar4 = 0; uVar4 < (data->cbcs).num_actions; uVar4 = uVar4 + 1) {
    local_60.score = 0.0;
    local_60.action = uVar4;
    v_array<ACTION_SCORE::action_score>::push_back(&probs,&local_60);
  }
  uVar3 = data->bag_size;
  Var1 = (unkuint9)uVar3;
  for (i_00 = 0; i_00 < uVar3; i_00 = i_00 + 1) {
    uVar2 = BS::weight_gen(data->all);
    if (uVar2 == 0) {
      LEARNER::learner<char,_example>::predict(base,ec,i_00);
    }
    else {
      LEARNER::learner<char,_example>::learn(base,ec,i_00);
    }
    uVar4 = (ec->pred).multiclass - 1;
    probs._begin[uVar4].score = probs._begin[uVar4].score + 1.0 / (float)(unkint9)Var1;
    for (uVar4 = 1; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      LEARNER::learner<char,_example>::learn(base,ec,i_00);
    }
    uVar3 = data->bag_size;
  }
  (ec->pred).a_s.end_array = probs.end_array;
  (ec->pred).scalars.erase_count = probs.erase_count;
  (ec->pred).a_s._begin = probs._begin;
  (ec->pred).a_s._end = probs._end;
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  action_scores probs = ec.pred.a_s;
  probs.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
  float prob = 1.f / (float)data.bag_size;
  for (size_t i = 0; i < data.bag_size; i++)
  {
    uint32_t count = BS::weight_gen(*data.all);
    if (is_learn && count > 0)
      base.learn(ec, i);
    else
      base.predict(ec, i);
    uint32_t chosen = ec.pred.multiclass - 1;
    probs[chosen].score += prob;
    if (is_learn)
      for (uint32_t j = 1; j < count; j++) base.learn(ec, i);
  }

  ec.pred.a_s = probs;
}